

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void fetchTransformedBilinearARGB32PM_downscale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uchar *puVar17;
  undefined1 auVar18 [16];
  uint disty;
  uint uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  uint *puVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar37;
  undefined1 auVar35 [12];
  undefined1 auVar36 [16];
  short sVar38;
  short sVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  short sVar44;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  
  iVar23 = *fy >> 0x10;
  iVar26 = image->y2 + -1;
  iVar27 = iVar26;
  if (iVar23 < iVar26) {
    iVar26 = iVar23;
    iVar27 = iVar23 + 1;
  }
  iVar22 = image->y1;
  if (iVar23 < iVar22) {
    iVar26 = iVar22;
  }
  disty = (uint)*fy >> 8 & 0xff;
  if (iVar23 < iVar22) {
    iVar27 = iVar22;
  }
  puVar17 = image->imageData;
  lVar24 = (long)iVar26 * image->bytesPerLine;
  lVar25 = (long)iVar27 * image->bytesPerLine;
  iVar26 = image->x1;
  iVar27 = image->x2;
  for (; auVar18 = _DAT_0060d6f0, b < end; b = b + 1) {
    iVar23 = image->x1;
    if ((iVar23 <= *(short *)((long)fx + 2)) &&
       (iVar23 = image->x2 + -1, *(short *)((long)fx + 2) < iVar23)) break;
    uVar19 = INTERPOLATE_PIXEL_256
                       (*(uint *)(puVar17 + (long)iVar23 * 4 + lVar24),0x100 - disty,
                        *(uint *)(puVar17 + (long)iVar23 * 4 + lVar25),disty);
    *b = uVar19;
    *fx = *fx + fdx;
  }
  if (fdx < 1) {
    iVar23 = *fx;
    puVar31 = end;
    if (-1 < fdx) goto LAB_005ae05a;
    lVar21 = (long)iVar26 * 0x10000 - (long)iVar23;
    uVar29 = (ulong)fdx;
  }
  else {
    iVar23 = *fx;
    lVar21 = ((long)iVar27 * 0x10000 + -0x10000) - (long)iVar23;
    uVar29 = (ulong)(uint)fdx;
  }
  puVar31 = b + lVar21 / (long)uVar29;
  if (end < b + lVar21 / (long)uVar29) {
    puVar31 = end;
  }
LAB_005ae05a:
  auVar32 = ZEXT416(disty + 8 >> 4);
  auVar33 = pshuflw(auVar32,auVar32,0);
  sVar38 = auVar33._0_2_;
  sVar39 = auVar33._2_2_;
  iVar26 = iVar23 + fdx + fdx;
  auVar34._12_4_ = iVar26 + fdx;
  auVar34._8_4_ = iVar26;
  auVar34._4_4_ = iVar23 + fdx;
  auVar34._0_4_ = iVar23;
  auVar32._4_2_ = sVar38;
  auVar32._0_4_ = auVar33._0_4_;
  auVar32._6_2_ = sVar39;
  auVar32._8_2_ = sVar38;
  auVar32._10_2_ = sVar39;
  auVar32._12_2_ = sVar38;
  auVar32._14_2_ = sVar39;
  auVar32 = psllw(auVar32,4);
  for (; uVar20 = auVar34._0_4_, b < puVar31 + -3; b = b + 4) {
    iVar27 = auVar34._4_4_;
    uVar37 = auVar34._8_4_;
    iVar23 = auVar34._12_4_;
    lVar30 = (ulong)auVar34._6_2_ * 4;
    uVar29 = (ulong)((uVar37 >> 0x10) << 2);
    lVar28 = (ulong)auVar34._14_2_ * 4;
    uVar1 = *(undefined4 *)(puVar17 + lVar30 + lVar24);
    lVar21 = (ulong)auVar34._2_2_ * 4;
    uVar2 = *(undefined4 *)(puVar17 + lVar21 + lVar24);
    auVar40._4_4_ = uVar1;
    auVar40._0_4_ = uVar2;
    uVar3 = *(undefined4 *)(puVar17 + lVar28 + lVar24);
    uVar4 = *(undefined4 *)(puVar17 + uVar29 + lVar24);
    auVar40._12_4_ = uVar3;
    auVar40._8_4_ = uVar4;
    uVar5 = *(undefined4 *)(puVar17 + lVar30 + lVar24 + 4);
    uVar6 = *(undefined4 *)(puVar17 + lVar21 + lVar24 + 4);
    auVar41._4_4_ = uVar5;
    auVar41._0_4_ = uVar6;
    uVar7 = *(undefined4 *)(puVar17 + lVar28 + lVar24 + 4);
    uVar8 = *(undefined4 *)(puVar17 + uVar29 + lVar24 + 4);
    auVar41._12_4_ = uVar7;
    auVar41._8_4_ = uVar8;
    uVar9 = *(undefined4 *)(puVar17 + lVar30 + lVar25);
    uVar10 = *(undefined4 *)(puVar17 + lVar21 + lVar25);
    auVar42._4_4_ = uVar9;
    auVar42._0_4_ = uVar10;
    uVar11 = *(undefined4 *)(puVar17 + lVar28 + lVar25);
    uVar12 = *(undefined4 *)(puVar17 + uVar29 + lVar25);
    auVar42._12_4_ = uVar11;
    auVar42._8_4_ = uVar12;
    uVar13 = *(undefined4 *)(puVar17 + lVar30 + lVar25 + 4);
    uVar14 = *(undefined4 *)(puVar17 + lVar21 + lVar25 + 4);
    auVar43._4_4_ = uVar13;
    auVar43._0_4_ = uVar14;
    uVar15 = *(undefined4 *)(puVar17 + lVar28 + lVar25 + 4);
    uVar16 = *(undefined4 *)(puVar17 + uVar29 + lVar25 + 4);
    auVar45._0_8_ = CONCAT44(uVar15,uVar16);
    auVar45._8_8_ = 0;
    auVar43._8_8_ = auVar45._0_8_;
    iVar26 = CONCAT22(auVar34._2_2_ >> 8,auVar34._0_2_ >> 8);
    auVar35._0_8_ = CONCAT26(auVar34._6_2_ >> 8,CONCAT24(auVar34._4_2_ >> 8,iVar26));
    auVar35._8_2_ = auVar34._8_2_ >> 8;
    auVar35._10_2_ = auVar34._10_2_ >> 8;
    auVar33._12_2_ = auVar34._12_2_ >> 8;
    auVar33._0_12_ = auVar35;
    auVar33._14_2_ = auVar34._14_2_ >> 8;
    auVar36._0_4_ = iVar26 + 8;
    auVar36._4_4_ = (int)((ulong)auVar35._0_8_ >> 0x20) + 8;
    auVar36._8_4_ = auVar35._8_4_ + 8;
    auVar36._12_4_ = auVar33._12_4_ + 8;
    auVar33 = pshuflw(auVar36,auVar36,0xa0);
    auVar33 = pshufhw(auVar45,auVar33,0xa0);
    auVar46._0_2_ = auVar33._0_2_ >> 4;
    auVar46._2_2_ = auVar33._2_2_ >> 4;
    auVar46._4_2_ = auVar33._4_2_ >> 4;
    auVar46._6_2_ = auVar33._6_2_ >> 4;
    auVar46._8_2_ = auVar33._8_2_ >> 4;
    auVar46._10_2_ = auVar33._10_2_ >> 4;
    auVar46._12_2_ = auVar33._12_2_ >> 4;
    auVar46._14_2_ = auVar33._14_2_ >> 4;
    sVar62 = auVar46._0_2_ * sVar38;
    sVar64 = auVar46._2_2_ * sVar39;
    sVar66 = auVar46._4_2_ * sVar38;
    sVar68 = auVar46._6_2_ * sVar39;
    sVar70 = auVar46._8_2_ * sVar38;
    sVar72 = auVar46._10_2_ * sVar39;
    sVar74 = auVar46._12_2_ * sVar38;
    sVar76 = auVar46._14_2_ * sVar39;
    auVar33 = psllw(auVar46,4);
    sVar44 = auVar33._0_2_ - sVar62;
    sVar47 = auVar33._2_2_ - sVar64;
    sVar48 = auVar33._4_2_ - sVar66;
    sVar49 = auVar33._6_2_ - sVar68;
    sVar50 = auVar33._8_2_ - sVar70;
    sVar51 = auVar33._10_2_ - sVar72;
    sVar52 = auVar33._12_2_ - sVar74;
    sVar53 = auVar33._14_2_ - sVar76;
    sVar54 = auVar32._0_2_ - sVar62;
    sVar55 = auVar32._2_2_ - sVar64;
    sVar56 = auVar32._4_2_ - sVar66;
    sVar57 = auVar32._6_2_ - sVar68;
    sVar58 = auVar32._8_2_ - sVar70;
    sVar59 = auVar32._10_2_ - sVar72;
    sVar60 = auVar32._12_2_ - sVar74;
    sVar61 = auVar32._14_2_ - sVar76;
    auVar43 = auVar43 & auVar18;
    sVar63 = (sVar62 - (auVar32._0_2_ + auVar33._0_2_)) + 0x100;
    sVar65 = (sVar64 - (auVar32._2_2_ + auVar33._2_2_)) + 0x100;
    sVar67 = (sVar66 - (auVar32._4_2_ + auVar33._4_2_)) + 0x100;
    sVar69 = (sVar68 - (auVar32._6_2_ + auVar33._6_2_)) + 0x100;
    sVar71 = (sVar70 - (auVar32._8_2_ + auVar33._8_2_)) + 0x100;
    sVar73 = (sVar72 - (auVar32._10_2_ + auVar33._10_2_)) + 0x100;
    sVar75 = (sVar74 - (auVar32._12_2_ + auVar33._12_2_)) + 0x100;
    sVar77 = (sVar76 - (auVar32._14_2_ + auVar33._14_2_)) + 0x100;
    auVar40 = auVar40 & auVar18;
    auVar41 = auVar41 & auVar18;
    auVar42 = auVar42 & auVar18;
    *(ushort *)b = (ushort)(auVar43._0_2_ * sVar62 + auVar42._0_2_ * sVar54 + auVar41._0_2_ * sVar44
                           + auVar40._0_2_ * sVar63) >> 8 |
                   ((ushort)uVar14 >> 8) * sVar62 +
                   ((ushort)uVar10 >> 8) * sVar54 + ((ushort)uVar6 >> 8) * sVar44 +
                   ((ushort)uVar2 >> 8) * sVar63 & 0xff00;
    *(ushort *)((long)b + 2) =
         (ushort)(auVar43._2_2_ * sVar64 + auVar42._2_2_ * sVar55 + auVar41._2_2_ * sVar47 +
                 auVar40._2_2_ * sVar65) >> 8 |
         (ushort)((uint)uVar14 >> 0x18) * sVar64 +
         (ushort)((uint)uVar10 >> 0x18) * sVar55 + (ushort)((uint)uVar6 >> 0x18) * sVar47 +
         (ushort)((uint)uVar2 >> 0x18) * sVar65 & 0xff00;
    *(ushort *)(b + 1) =
         (ushort)(auVar43._4_2_ * sVar66 + auVar42._4_2_ * sVar56 + auVar41._4_2_ * sVar48 +
                 auVar40._4_2_ * sVar67) >> 8 |
         ((ushort)uVar13 >> 8) * sVar66 +
         ((ushort)uVar9 >> 8) * sVar56 + ((ushort)uVar5 >> 8) * sVar48 +
         ((ushort)uVar1 >> 8) * sVar67 & 0xff00;
    *(ushort *)((long)b + 6) =
         (ushort)(auVar43._6_2_ * sVar68 + auVar42._6_2_ * sVar57 + auVar41._6_2_ * sVar49 +
                 auVar40._6_2_ * sVar69) >> 8 |
         (ushort)((uint)uVar13 >> 0x18) * sVar68 +
         (ushort)((uint)uVar9 >> 0x18) * sVar57 + (ushort)((uint)uVar5 >> 0x18) * sVar49 +
         (ushort)((uint)uVar1 >> 0x18) * sVar69 & 0xff00;
    *(ushort *)(b + 2) =
         (ushort)(auVar43._8_2_ * sVar70 + auVar42._8_2_ * sVar58 + auVar41._8_2_ * sVar50 +
                 auVar40._8_2_ * sVar71) >> 8 |
         ((ushort)uVar16 >> 8) * sVar70 +
         ((ushort)uVar12 >> 8) * sVar58 + ((ushort)uVar8 >> 8) * sVar50 +
         ((ushort)uVar4 >> 8) * sVar71 & 0xff00;
    *(ushort *)((long)b + 10) =
         (ushort)(auVar43._10_2_ * sVar72 + auVar42._10_2_ * sVar59 + auVar41._10_2_ * sVar51 +
                 auVar40._10_2_ * sVar73) >> 8 |
         (ushort)((uint)uVar16 >> 0x18) * sVar72 +
         (ushort)((uint)uVar12 >> 0x18) * sVar59 + (ushort)((uint)uVar8 >> 0x18) * sVar51 +
         (ushort)((uint)uVar4 >> 0x18) * sVar73 & 0xff00;
    *(ushort *)(b + 3) =
         (ushort)(auVar43._12_2_ * sVar74 + auVar42._12_2_ * sVar60 + auVar41._12_2_ * sVar52 +
                 auVar40._12_2_ * sVar75) >> 8 |
         ((ushort)uVar15 >> 8) * sVar74 +
         ((ushort)uVar11 >> 8) * sVar60 + ((ushort)uVar7 >> 8) * sVar52 +
         ((ushort)uVar3 >> 8) * sVar75 & 0xff00;
    *(ushort *)((long)b + 0xe) =
         (ushort)(auVar43._14_2_ * sVar76 + auVar42._14_2_ * sVar61 + auVar41._14_2_ * sVar53 +
                 auVar40._14_2_ * sVar77) >> 8 |
         (ushort)((uint)uVar15 >> 0x18) * sVar76 +
         (ushort)((uint)uVar11 >> 0x18) * sVar61 + (ushort)((uint)uVar7 >> 0x18) * sVar53 +
         (ushort)((uint)uVar3 >> 0x18) * sVar77 & 0xff00;
    auVar34._0_4_ = uVar20 + fdx * 4;
    auVar34._4_4_ = iVar27 + fdx * 4;
    auVar34._8_4_ = uVar37 + fdx * 4;
    auVar34._12_4_ = iVar23 + fdx * 4;
  }
  *fx = uVar20;
  for (; b < puVar31; b = b + 1) {
    uVar19 = interpolate_4_pixels
                       ((uint *)(puVar17 + (long)((int)uVar20 >> 0x10) * 4 + lVar24),
                        (uint *)(puVar17 + (long)((int)uVar20 >> 0x10) * 4 + lVar25),
                        uVar20 >> 8 & 0xff,disty);
    *b = uVar19;
    uVar20 = *fx + fdx;
    *fx = uVar20;
  }
  for (; b < end; b = b + 1) {
    iVar22 = (int)uVar20 >> 0x10;
    iVar26 = image->x1;
    iVar27 = image->x2 + -1;
    iVar23 = iVar27;
    if (iVar22 < iVar27) {
      iVar27 = iVar22;
      iVar23 = iVar22 + 1;
    }
    if (iVar22 < iVar26) {
      iVar23 = iVar26;
      iVar27 = iVar26;
    }
    uVar19 = interpolate_4_pixels
                       (*(uint *)(puVar17 + (long)iVar27 * 4 + lVar24),
                        *(uint *)(puVar17 + (long)iVar23 * 4 + lVar24),
                        *(uint *)(puVar17 + (long)iVar27 * 4 + lVar25),
                        *(uint *)(puVar17 + (long)iVar23 * 4 + lVar25),uVar20 >> 8 & 0xff,disty);
    *b = uVar19;
    uVar20 = *fx + fdx;
    *fx = uVar20;
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_downscale_helper(uint *b, uint *end, const QTextureData &image,
                                                                          int &fx, int &fy, int fdx, int /*fdy*/)
{
    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uint *s1 = (const uint *)image.scanLine(y1);
    const uint *s2 = (const uint *)image.scanLine(y2);
    const int disty8 = (fy & 0x0000ffff) >> 8;
    const int disty4 = (disty8 + 0x08) >> 4;

    if (blendType != BlendTransformedBilinearTiled) {
        const qint64 min_fx = qint64(image.x1) * fixed_scale;
        const qint64 max_fx = qint64(image.x2 - 1) * fixed_scale;
        while (b < end) {
            int x1 = (fx >> 16);
            int x2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            if (x1 != x2)
                break;
            uint top = s1[x1];
            uint bot = s2[x1];
            *b = INTERPOLATE_PIXEL_256(top, 256 - disty8, bot, disty8);
            fx += fdx;
            ++b;
        }
        uint *boundedEnd = end;
        if (fdx > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fx - fx) / fdx);
        else if (fdx < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fx - fx) / fdx);
        // A fast middle part without boundary checks
#if defined(__SSE2__)
        const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
        const __m128i v_256 = _mm_set1_epi16(256);
        const __m128i v_disty = _mm_set1_epi16(disty4);
        const __m128i v_fdx = _mm_set1_epi32(fdx*4);
        const __m128i v_fx_r = _mm_set1_epi32(0x8);
        __m128i v_fx = _mm_setr_epi32(fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx);

        while (b < boundedEnd - 3) {
            __m128i offset = _mm_srli_epi32(v_fx, 16);
            const int offset0 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset1 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset2 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset3 = _mm_cvtsi128_si32(offset);
            const __m128i tl = _mm_setr_epi32(s1[offset0], s1[offset1], s1[offset2], s1[offset3]);
            const __m128i tr = _mm_setr_epi32(s1[offset0 + 1], s1[offset1 + 1], s1[offset2 + 1], s1[offset3 + 1]);
            const __m128i bl = _mm_setr_epi32(s2[offset0], s2[offset1], s2[offset2], s2[offset3]);
            const __m128i br = _mm_setr_epi32(s2[offset0 + 1], s2[offset1 + 1], s2[offset2 + 1], s2[offset3 + 1]);

            __m128i v_distx = _mm_srli_epi16(v_fx, 8);
            v_distx = _mm_srli_epi16(_mm_add_epi32(v_distx, v_fx_r), 4);
            v_distx = _mm_shufflehi_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));
            v_distx = _mm_shufflelo_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));

            interpolate_4_pixels_16_sse2(tl, tr, bl, br, v_distx, v_disty, colorMask, v_256, b);
            b += 4;
            v_fx = _mm_add_epi32(v_fx, v_fdx);
        }
        fx = _mm_cvtsi128_si32(v_fx);
#elif defined(__ARM_NEON__)
        const int16x8_t colorMask = vdupq_n_s16(0x00ff);
        const int16x8_t invColorMask = vmvnq_s16(colorMask);
        const int16x8_t v_256 = vdupq_n_s16(256);
        const int16x8_t v_disty = vdupq_n_s16(disty4);
        const int16x8_t v_disty_ = vshlq_n_s16(v_disty, 4);
        int32x4_t v_fdx = vdupq_n_s32(fdx*4);

        int32x4_t v_fx = vmovq_n_s32(fx);
        v_fx = vsetq_lane_s32(fx + fdx, v_fx, 1);
        v_fx = vsetq_lane_s32(fx + fdx * 2, v_fx, 2);
        v_fx = vsetq_lane_s32(fx + fdx * 3, v_fx, 3);

        const int32x4_t v_ffff_mask = vdupq_n_s32(0x0000ffff);
        const int32x4_t v_fx_r = vdupq_n_s32(0x0800);

         // Pre-initialize to work-around code-analysis warnings/crashes in MSVC:
        uint32x4x2_t v_top = {};
        uint32x4x2_t v_bot = {};
        while (b < boundedEnd - 3) {
            int x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 0);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 0);
            x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 1);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 1);
            x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 2);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 2);
            x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 3);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 3);

            int32x4_t v_distx = vshrq_n_s32(vaddq_s32(vandq_s32(v_fx, v_ffff_mask), v_fx_r), 12);
            v_distx = vorrq_s32(v_distx, vshlq_n_s32(v_distx, 16));

            interpolate_4_pixels_16_neon(
                        vreinterpretq_s16_u32(v_top.val[0]), vreinterpretq_s16_u32(v_top.val[1]),
                    vreinterpretq_s16_u32(v_bot.val[0]), vreinterpretq_s16_u32(v_bot.val[1]),
                    vreinterpretq_s16_s32(v_distx), v_disty, v_disty_,
                    colorMask, invColorMask, v_256, b);
            b+=4;
            v_fx = vaddq_s32(v_fx, v_fdx);
        }
#elif defined (__loongarch_sx)
        const __m128i shuffleMask = (__m128i)(v8i16){0, 0, 2, 2, 4, 4, 6, 6};
        const __m128i v_disty = __lsx_vreplgr2vr_h(disty4);
        const __m128i v_fdx = __lsx_vreplgr2vr_w(fdx*4);
        const __m128i v_fx_r = __lsx_vreplgr2vr_w(0x8);
        __m128i v_fx = (__m128i)(v4i32){fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx};

        while (b < boundedEnd - 3) {
            __m128i offset = __lsx_vsrli_w(v_fx, 16);
            const int offset0 = __lsx_vpickve2gr_w(offset, 0);
            const int offset1 = __lsx_vpickve2gr_w(offset, 1);
            const int offset2 = __lsx_vpickve2gr_w(offset, 2);
            const int offset3 = __lsx_vpickve2gr_w(offset, 3);
            const __m128i tl = (__m128i)(v4u32){s1[offset0], s1[offset1], s1[offset2], s1[offset3]};
            const __m128i tr = (__m128i)(v4u32){s1[offset0 + 1], s1[offset1 + 1], s1[offset2 + 1], s1[offset3 + 1]};
            const __m128i bl = (__m128i)(v4u32){s2[offset0], s2[offset1], s2[offset2], s2[offset3]};
            const __m128i br = (__m128i)(v4u32){s2[offset0 + 1], s2[offset1 + 1], s2[offset2 + 1], s2[offset3 + 1]};

            __m128i v_distx = __lsx_vsrli_h(v_fx, 8);
            v_distx = __lsx_vsrli_h(__lsx_vadd_w(v_distx, v_fx_r), 4);
            v_distx = __lsx_vshuf_h(shuffleMask, v_distx, v_distx);

            interpolate_4_pixels_16_lsx(tl, tr, bl, br, v_distx, v_disty, b);
            b += 4;
            v_fx = __lsx_vadd_w(v_fx, v_fdx);
        }
        fx = __lsx_vpickve2gr_w(v_fx, 0);
#endif
        while (b < boundedEnd) {
            int x = (fx >> 16);
            if (hasFastInterpolate4()) {
                int distx8 = (fx & 0x0000ffff) >> 8;
                *b = interpolate_4_pixels(s1 + x, s2 + x, distx8, disty8);
            } else {
                int distx4 = ((fx & 0x0000ffff) + 0x0800) >> 12;
                *b = interpolate_4_pixels_16(s1[x], s1[x + 1], s2[x], s2[x + 1], distx4, disty4);
            }
            fx += fdx;
            ++b;
        }
    }

    while (b < end) {
        int x1 = (fx >> 16);
        int x2;
        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        uint tl = s1[x1];
        uint tr = s1[x2];
        uint bl = s2[x1];
        uint br = s2[x2];
        if (hasFastInterpolate4()) {
            int distx8 = (fx & 0x0000ffff) >> 8;
            *b = interpolate_4_pixels(tl, tr, bl, br, distx8, disty8);
        } else {
            int distx4 = ((fx & 0x0000ffff) + 0x0800) >> 12;
            *b = interpolate_4_pixels_16(tl, tr, bl, br, distx4, disty4);
        }
        fx += fdx;
        ++b;
    }
}